

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvactxinfo.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  uint32_t uVar2;
  int c;
  char **argv_local;
  int argc_local;
  
  iVar1 = nva_init();
  if (iVar1 == 0) {
    while (iVar1 = getopt(argc,argv,"c:"), iVar1 != -1) {
      if (iVar1 == 99) {
        __isoc99_sscanf(_optarg,"%d",&cnum);
      }
    }
    if (cnum < nva_cardsnum) {
      a = 0x40981c;
      uVar2 = nva_rd32(cnum,0);
      dev = (uVar2 & 0x1ff00000) >> 0x14;
      print_hwinfo();
      argv_local._4_4_ = 0;
    }
    else {
      if (nva_cardsnum == 0) {
        fprintf(_stderr,"No cards found.\n");
      }
      else {
        fprintf(_stderr,"No such card.\n");
      }
      argv_local._4_4_ = 1;
    }
  }
  else {
    fprintf(_stderr,"PCI init failure!\n");
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}
	int c;
	while ((c = getopt (argc, argv, "c:")) != -1)
		switch (c) {
			case 'c':
				sscanf(optarg, "%d", &cnum);
				break;
		}
	if (cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}

	a = NVE0_HUB_SCRATCH_7;
	dev = nva_rd32(cnum, 0x000000);
	dev &= 0x1ff00000;
	dev >>= 20;

	print_hwinfo();

	return 0;
}